

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_EnvelopePhase3(opm_t *chip)

{
  uint32_t uVar1;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar1 = chip->cycles;
  chip->eg_shift = chip->eg_timershift_lock + (char)((int)(uint)chip->eg_rate[0] >> 2) & 0xf;
  chip->eg_inchi = (uint8_t)eg_stephi[(int)(chip->eg_rate[0] & 3)][(int)(chip->eg_timer_lock & 3)];
  chip->eg_outtemp[1] = chip->eg_outtemp[0];
  chip->eg_outtemp[0] = chip->eg_level[uVar1 + 0x1f & 0x1f] + chip->eg_am;
  if ((chip->eg_outtemp[0] & 0x400) != 0) {
    chip->eg_outtemp[0] = 0x3ff;
  }
  return;
}

Assistant:

static void OPM_EnvelopePhase3(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 31) % 32;
    chip->eg_shift = (chip->eg_timershift_lock + (chip->eg_rate[0] >> 2)) & 15;
    chip->eg_inchi = eg_stephi[chip->eg_rate[0] & 3][chip->eg_timer_lock & 3];

    chip->eg_outtemp[1] = chip->eg_outtemp[0];
    chip->eg_outtemp[0] = chip->eg_level[slot] + chip->eg_am;
    if (chip->eg_outtemp[0] & 1024)
    {
        chip->eg_outtemp[0] = 1023;
    }
}